

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V5_annotation.cpp
# Opt level: O1

bool __thiscall
ON_OBSOLETE_V2_AnnotationArrow::GetBBox
          (ON_OBSOLETE_V2_AnnotationArrow *this,double *boxmin,double *boxmax,bool bGrowBox)

{
  bool bVar1;
  double *pdVar2;
  undefined7 in_register_00000009;
  
  pdVar2 = ON_3dPoint::operator_cast_to_double_(&this->m_tail);
  bVar1 = ON_GetPointListBoundingBox
                    (3,false,1,3,pdVar2,boxmin,boxmax,(int)CONCAT71(in_register_00000009,bGrowBox));
  if (bVar1) {
    pdVar2 = ON_3dPoint::operator_cast_to_double_(&this->m_head);
    bVar1 = ON_GetPointListBoundingBox(3,false,1,3,pdVar2,boxmin,boxmax,1);
  }
  return bVar1;
}

Assistant:

bool ON_OBSOLETE_V2_AnnotationArrow::GetBBox( double* boxmin, double* boxmax, bool bGrowBox ) const
{
  bool rc = ON_GetPointListBoundingBox( 3, false, 1, 3, m_tail, boxmin, boxmax, bGrowBox?true:false );
  if (rc)
    rc = ON_GetPointListBoundingBox( 3, false, 1, 3, m_head, boxmin, boxmax, true );
  return rc;
}